

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

bool testing::internal::String::EndsWithCaseInsensitive(string *str,string *suffix)

{
  char *__s2;
  int iVar1;
  char *__s1;
  bool bVar2;
  
  if (str->_M_string_length < suffix->_M_string_length) {
    bVar2 = false;
  }
  else {
    __s1 = (str->_M_dataplus)._M_p + (str->_M_string_length - suffix->_M_string_length);
    __s2 = (suffix->_M_dataplus)._M_p;
    bVar2 = __s1 == (char *)0x0 && __s2 == (char *)0x0;
    if (__s2 != (char *)0x0 && __s1 != (char *)0x0) {
      iVar1 = strcasecmp(__s1,__s2);
      return iVar1 == 0;
    }
  }
  return bVar2;
}

Assistant:

bool String::EndsWithCaseInsensitive(
    const std::string& str, const std::string& suffix) {
  const size_t str_len = str.length();
  const size_t suffix_len = suffix.length();
  return (str_len >= suffix_len) &&
         CaseInsensitiveCStringEquals(str.c_str() + str_len - suffix_len,
                                      suffix.c_str());
}